

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool gflags::ReadFromFlagsFile(string *filename,char *prog_name,bool errors_are_fatal)

{
  char *filename_00;
  bool bVar1;
  _anonymous_namespace_ local_40 [39];
  byte local_19;
  char *pcStack_18;
  bool errors_are_fatal_local;
  char *prog_name_local;
  string *filename_local;
  
  local_19 = errors_are_fatal;
  pcStack_18 = prog_name;
  prog_name_local = (char *)filename;
  filename_00 = (char *)std::__cxx11::string::c_str();
  (anonymous_namespace)::ReadFileIntoString_abi_cxx11_(local_40,filename_00);
  bVar1 = ReadFlagsFromString((string *)local_40,pcStack_18,(bool)(local_19 & 1));
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool ReadFromFlagsFile(const string& filename, const char* prog_name,
                       bool errors_are_fatal) {
  return ReadFlagsFromString(ReadFileIntoString(filename.c_str()),
                             prog_name, errors_are_fatal);
}